

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int asl::myltoa(Long x,char *s)

{
  uint local_50;
  int local_4c;
  int j;
  int i;
  char ss [32];
  char *s_local;
  Long x_local;
  
  local_4c = 0;
  if (x == 0) {
    *s = '0';
    s[1] = '\0';
    x_local._4_4_ = 1;
  }
  else {
    s_local = (char *)x;
    if (x < 0) {
      *s = '-';
      s_local = (char *)-x;
    }
    local_50 = (uint)(x < 0);
    for (; s_local != (char *)0x0; s_local = (char *)((long)s_local / 10)) {
      *(char *)((long)&j + (long)local_4c) = (char)((long)s_local % 10) + '0';
      local_4c = local_4c + 1;
    }
    while (0 < local_4c) {
      local_4c = local_4c + -1;
      s[(int)local_50] = *(char *)((long)&j + (long)local_4c);
      local_50 = local_50 + 1;
    }
    s[(int)local_50] = '\0';
    x_local._4_4_ = local_50;
  }
  return x_local._4_4_;
}

Assistant:

int myltoa(Long x, char* s)
{
	char ss[32];
	int i = 0, j = 0;
	if (x == 0)
	{
		s[0] = '0';
		s[1] = '\0';
		return 1;
	}
	if (x<0)
	{
		s[j++] = '-';
		x = -x;
	}
	while (x != 0) {
		ss[i++] = char(x % 10) + '0';
		x = x / 10;
	}
	while (i > 0)
		s[j++] = ss[--i];
	s[j] = '\0';
	return j;
}